

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-bookmarks.cc
# Opt level: O2

void show_bookmark_details
               (QPDFOutlineObjectHelper *outline,vector<int,_std::allocator<int>_> *numbers)

{
  int *piVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  char *pcVar7;
  int *number;
  int *piVar8;
  char *pcVar9;
  QPDFObjectHandle dest_page;
  string target;
  QPDFObjGen local_58;
  string local_50;
  
  if (style != st_none) {
    if (style == st_lines) {
      print_lines(numbers);
      poVar4 = std::operator<<((ostream *)&std::cout,"|");
      std::endl<char,std::char_traits<char>>(poVar4);
      print_lines(numbers);
      pcVar9 = "+-+ ";
    }
    else {
      piVar1 = (numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pcVar9 = " ";
      for (piVar8 = (numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start; piVar8 != piVar1; piVar8 = piVar8 + 1) {
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar8);
        std::operator<<(poVar4,".");
      }
    }
    std::operator<<((ostream *)&std::cout,pcVar9);
  }
  if (show_open == '\x01') {
    iVar3 = QPDFOutlineObjectHelper::getCount();
    pcVar9 = "(>) ";
    if (0 < iVar3) {
      pcVar9 = "(v) ";
    }
    pcVar7 = "( ) ";
    if (iVar3 != 0) {
      pcVar7 = pcVar9;
    }
    std::operator<<((ostream *)&std::cout,pcVar7);
  }
  if (show_targets == '\x01') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&target,"unknown",(allocator<char> *)&local_50);
    QPDFOutlineObjectHelper::getDestPage();
    cVar2 = QPDFObjectHandle::isNull();
    if (cVar2 == '\0') {
      local_50._M_dataplus._M_p =
           (pointer)qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&dest_page.super_BaseHandle);
      sVar5 = std::
              map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
              ::count(&page_map,(key_type *)&local_50);
      if (sVar5 != 0) {
        local_58 = qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&dest_page.super_BaseHandle);
        pmVar6 = std::
                 map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
                 ::operator[](&page_map,&local_58);
        std::__cxx11::to_string(&local_50,*pmVar6);
        std::__cxx11::string::operator=((string *)&target,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"[ -> ");
    poVar4 = std::operator<<(poVar4,(string *)&target);
    std::operator<<(poVar4," ] ");
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&dest_page.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)&target);
  }
  QPDFOutlineObjectHelper::getTitle_abi_cxx11_();
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)&target);
  std::operator<<(poVar4,'\n');
  std::__cxx11::string::~string((string *)&target);
  return;
}

Assistant:

void
show_bookmark_details(QPDFOutlineObjectHelper outline, std::vector<int> numbers)
{
    // No default so gcc will warn on missing tag
    switch (style) {
    case st_none:
        QTC::TC("examples", "pdf-bookmarks none");
        break;

    case st_numbers:
        QTC::TC("examples", "pdf-bookmarks numbers");
        for (auto const& number: numbers) {
            std::cout << number << ".";
        }
        std::cout << " ";
        break;

    case st_lines:
        QTC::TC("examples", "pdf-bookmarks lines");
        print_lines(numbers);
        std::cout << "|" << std::endl;
        print_lines(numbers);
        std::cout << "+-+ ";
        break;
    }

    if (show_open) {
        int count = outline.getCount();
        if (count) {
            QTC::TC("examples", "pdf-bookmarks has count");
            if (count > 0) {
                // hierarchy is open at this point
                QTC::TC("examples", "pdf-bookmarks open");
                std::cout << "(v) ";
            } else {
                QTC::TC("examples", "pdf-bookmarks closed");
                std::cout << "(>) ";
            }
        } else {
            QTC::TC("examples", "pdf-bookmarks no count");
            std::cout << "( ) ";
        }
    }

    if (show_targets) {
        QTC::TC("examples", "pdf-bookmarks targets");
        std::string target = "unknown";
        QPDFObjectHandle dest_page = outline.getDestPage();
        if (!dest_page.isNull()) {
            QTC::TC("examples", "pdf-bookmarks dest");
            if (page_map.count(dest_page)) {
                target = std::to_string(page_map[dest_page]);
            }
        }
        std::cout << "[ -> " << target << " ] ";
    }

    std::cout << outline.getTitle() << '\n';
}